

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::buildPAT(TSMuxer *this)

{
  uint32_t uVar1;
  uint8_t *this_00;
  mapped_type_conflict2 *pmVar2;
  uint32_t size;
  TSPacket *tsPacket;
  TSMuxer *this_local;
  
  this->m_patBuffer[0] = 'G';
  this->m_patBuffer[1] = '\0';
  this->m_patBuffer[2] = '\0';
  this->m_patBuffer[3] = '\x10';
  this_00 = this->m_patBuffer;
  TSPacket::setPID((TSPacket *)this_00,0);
  *(uint *)this_00 = *(uint *)this_00 & 0xefffffff | 0x10000000;
  *(uint *)this_00 = *(uint *)this_00 & 0xffffbfff | 0x4000;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](&(this->m_pat).pmtPids,&SIT_PID);
  *pmVar2 = 0;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](&(this->m_pat).pmtPids,&DEFAULT_PMT_PID);
  *pmVar2 = 1;
  (this->m_pat).transport_stream_id = 0;
  uVar1 = TS_program_association_section::serialize(&this->m_pat,this->m_patBuffer + 4,0xb8);
  memset(this->m_patBuffer + (ulong)uVar1 + 4,0xff,(ulong)(0xb8 - uVar1));
  return;
}

Assistant:

void TSMuxer::buildPAT()
{
    *reinterpret_cast<uint32_t*>(m_patBuffer) = TSPacket::TS_FRAME_SYNC_BYTE + TSPacket::DATA_EXIST_BIT_VAL;
    const auto tsPacket = reinterpret_cast<TSPacket*>(m_patBuffer);
    tsPacket->setPID(PAT_PID);
    tsPacket->dataExists = 1;
    tsPacket->payloadStart = 1;
    m_pat.pmtPids[SIT_PID] = 0;          // add NIT. program number = 0
    m_pat.pmtPids[DEFAULT_PMT_PID] = 1;  // add PMT. program number = 1
    m_pat.transport_stream_id = 0;       // version of transport stream
    const uint32_t size =
        m_pat.serialize(m_patBuffer + TSPacket::TS_HEADER_SIZE, TS_FRAME_SIZE - TSPacket::TS_HEADER_SIZE);
    memset(m_patBuffer + TSPacket::TS_HEADER_SIZE + size, 0xff, TS_FRAME_SIZE - TSPacket::TS_HEADER_SIZE - size);
}